

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::openScope(Parser *this,vardef_t *vardef)

{
  FILE *__stream;
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>
  local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_38;
  vardef_t *local_18;
  vardef_t *vardef_local;
  Parser *this_local;
  
  local_18 = vardef;
  vardef_local = (vardef_t *)this;
  (**(vardef->name->super_Identifier).super_Terminal.super_AST._vptr_AST)();
  bVar1 = checkVarExists(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  __stream = _stdout;
  if (!bVar1) {
    (**(local_18->name->super_Identifier).super_Terminal.super_AST._vptr_AST)();
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                       (&local_88);
    fprintf(__stream,"\x1b[33m\t{{{ Variable [%s] open scope\n\x1b[0m",pcVar2);
    std::__cxx11::string::~string((string *)&local_88);
    local_18->defined = true;
    (**(local_18->name->super_Identifier).super_Terminal.super_AST._vptr_AST)();
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t_&,_true>
              (&local_c0,&local_e0,local_18);
    std::
    map<std::__cxx11::string,Parser::vardef_t,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Parser::vardef_t>>>
    ::insert<std::pair<std::__cxx11::string,Parser::vardef_t>>
              ((map<std::__cxx11::string,Parser::vardef_t,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Parser::vardef_t>>>
                *)&this->var_table,&local_c0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Parser::vardef_t>
    ::~pair(&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    return;
  }
  (**(local_18->name->super_Identifier).super_Terminal.super_AST._vptr_AST)(&local_68);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::data
                     (&local_68);
  fprintf(__stream,"\x1b[31m\tVariable [%s] already declared.\n\x1b[0m",pcVar2);
  std::__cxx11::string::~string((string *)&local_68);
  exit(1);
}

Assistant:

void Parser::openScope(vardef_t *vardef) {
    // First check if var exists, if it does, we have a problem
    if (checkVarExists(vardef->name->describe())) {
        fprintf(stdout, ANSI_COLOR_RED "\tVariable [%s] already declared.\n" ANSI_COLOR_RESET,
                vardef->name->describe().data());
        exit(1);
    }

    if (_VERBOSITY >= 3) {
        fprintf(stdout, ANSI_COLOR_YELLOW "\t{{{ Variable [%s] open scope\n" ANSI_COLOR_RESET,
                vardef->name->describe().data());
    }

    // Add to var_table
    vardef->defined = true;
    var_table.insert(std::pair<std::string, vardef_t>(vardef->name->describe(), *vardef));
}